

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_receive_raw_frame
              (AV1_COMP *cpi,aom_enc_frame_flags_t frame_flags,YV12_BUFFER_CONFIG *sd,
              int64_t time_stamp,int64_t end_time)

{
  aom_film_grain_t *film_grain;
  int iVar1;
  int iVar2;
  uint uVar3;
  SequenceHeader *pSVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  aom_denoise_and_model_t *ctx;
  aom_film_grain_table_t *paVar8;
  char *fmt;
  int iVar9;
  aom_internal_error_info *info;
  float fVar10;
  float fVar11;
  double y_noise_level;
  double local_38;
  
  pSVar4 = (cpi->common).seq_params;
  iVar1 = sd->subsampling_x;
  iVar2 = sd->subsampling_y;
  uVar3 = sd->flags;
  fVar10 = (cpi->oxcf).noise_level;
  iVar7 = 0;
  iVar9 = iVar7;
  if ((fVar10 <= 0.0) ||
     (((cpi->oxcf).pass == AOM_RC_FIRST_PASS && (iVar9 = 0, (cpi->oxcf).enable_dnl_denoising == 0)))
     ) goto LAB_001b7802;
  if ((cpi->oxcf).mode == '\x02') {
    local_38 = 0.0;
    av1_estimate_noise_level(sd,&local_38,0,0,pSVar4->bit_depth,0x10);
    fVar10 = 0.0;
    if (0.0 <= (float)(local_38 + -0.1)) {
      fVar10 = (float)(local_38 + -0.1);
    }
    fVar11 = (float)(~-(uint)(0.0 < fVar10) & (uint)fVar10 |
                    (uint)(fVar10 + 0.5) & -(uint)(0.0 < fVar10));
    fVar10 = 5.0;
    if (fVar11 <= 5.0) {
      fVar10 = fVar11;
    }
    (cpi->oxcf).noise_level = fVar10;
  }
  ctx = cpi->denoise_and_model;
  if (ctx == (aom_denoise_and_model_t *)0x0) {
    ctx = aom_denoise_and_model_alloc
                    (((cpi->common).seq_params)->bit_depth,(cpi->oxcf).noise_block_size,fVar10);
    cpi->denoise_and_model = ctx;
    if (ctx != (aom_denoise_and_model_t *)0x0) goto LAB_001b7735;
    info = (cpi->common).error;
    fmt = "Error allocating denoise and model";
LAB_001b77e2:
    aom_set_error(info,AOM_CODEC_MEM_ERROR,fmt);
    iVar9 = -1;
  }
  else {
LAB_001b7735:
    if (cpi->film_grain_table == (aom_film_grain_table_t *)0x0) {
      paVar8 = (aom_film_grain_table_t *)aom_malloc(0x10);
      cpi->film_grain_table = paVar8;
      if (paVar8 == (aom_film_grain_table_t *)0x0) {
        info = (cpi->common).error;
        fmt = "Error allocating grain table";
        goto LAB_001b77e2;
      }
      paVar8->head = (aom_film_grain_table_entry_t *)0x0;
      paVar8->tail = (aom_film_grain_table_entry_t *)0x0;
      ctx = cpi->denoise_and_model;
    }
    film_grain = &(cpi->common).film_grain_params;
    iVar6 = aom_denoise_and_model_run(ctx,sd,film_grain,(cpi->oxcf).enable_dnl_denoising);
    iVar9 = iVar7;
    if ((iVar6 != 0) && (film_grain->apply_grain != 0)) {
      aom_film_grain_table_append(cpi->film_grain_table,time_stamp,end_time,film_grain);
    }
  }
LAB_001b7802:
  iVar7 = av1_lookahead_push(cpi->ppi->lookahead,sd,time_stamp,end_time,uVar3 >> 3 & 1,
                             cpi->alloc_pyramid,frame_flags);
  if (iVar7 != 0) {
    aom_set_error((cpi->common).error,AOM_CODEC_ERROR,"av1_lookahead_push() failed");
    iVar9 = -1;
  }
  cVar5 = pSVar4->profile;
  if (cVar5 == '\0') {
    if (pSVar4->monochrome != '\0') {
      return iVar9;
    }
    if (iVar2 == 1 && iVar1 == 1) {
      return iVar9;
    }
    aom_set_error((cpi->common).error,AOM_CODEC_INVALID_PARAM,
                  "Non-4:2:0 color format requires profile 1 or 2");
    cVar5 = pSVar4->profile;
    iVar9 = -1;
  }
  if (cVar5 == '\x01') {
    if (iVar1 == 0 && iVar2 == 0) {
      return iVar9;
    }
    aom_set_error((cpi->common).error,AOM_CODEC_INVALID_PARAM,
                  "Profile 1 requires 4:4:4 color format");
    cVar5 = pSVar4->profile;
    iVar9 = -1;
  }
  if (((cVar5 == '\x02') && (pSVar4->bit_depth < 0xb)) && (iVar1 != 1 || iVar2 != 0)) {
    aom_set_error((cpi->common).error,AOM_CODEC_INVALID_PARAM,
                  "Profile 2 bit-depth <= 10 requires 4:2:2 color format");
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int av1_receive_raw_frame(AV1_COMP *cpi, aom_enc_frame_flags_t frame_flags,
                          const YV12_BUFFER_CONFIG *sd, int64_t time_stamp,
                          int64_t end_time) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  int res = 0;
  const int subsampling_x = sd->subsampling_x;
  const int subsampling_y = sd->subsampling_y;
  const int use_highbitdepth = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;

#if CONFIG_TUNE_VMAF
  if (!is_stat_generation_stage(cpi) &&
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_WITH_PREPROCESSING) {
    av1_vmaf_frame_preprocessing(cpi, sd);
  }
  if (!is_stat_generation_stage(cpi) &&
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_MAX_GAIN) {
    av1_vmaf_blk_preprocessing(cpi, sd);
  }
#endif

#if CONFIG_INTERNAL_STATS
  struct aom_usec_timer timer;
  aom_usec_timer_start(&timer);
#endif

#if CONFIG_AV1_TEMPORAL_DENOISING
  setup_denoiser_buffer(cpi);
#endif

#if CONFIG_DENOISE
  // even if denoise_noise_level is > 0, we don't need need to denoise on pass
  // 1 of 2 if enable_dnl_denoising is disabled since the 2nd pass will be
  // encoding the original (non-denoised) frame
  if (cpi->oxcf.noise_level > 0 && !(cpi->oxcf.pass == AOM_RC_FIRST_PASS &&
                                     !cpi->oxcf.enable_dnl_denoising)) {
#if !CONFIG_REALTIME_ONLY
    // Choose a synthetic noise level for still images for enhanced perceptual
    // quality based on an estimated noise level in the source, but only if
    // the noise level is set on the command line to > 0.
    if (cpi->oxcf.mode == ALLINTRA) {
      // No noise synthesis if source is very clean.
      // Uses a low edge threshold to focus on smooth areas.
      // Increase output noise setting a little compared to measured value.
      double y_noise_level = 0.0;
      av1_estimate_noise_level(sd, &y_noise_level, AOM_PLANE_Y, AOM_PLANE_Y,
                               cm->seq_params->bit_depth, 16);
      cpi->oxcf.noise_level = (float)(y_noise_level - 0.1);
      cpi->oxcf.noise_level = (float)AOMMAX(0.0, cpi->oxcf.noise_level);
      if (cpi->oxcf.noise_level > 0.0) {
        cpi->oxcf.noise_level += (float)0.5;
      }
      cpi->oxcf.noise_level = (float)AOMMIN(5.0, cpi->oxcf.noise_level);
    }

    if (apply_denoise_2d(cpi, sd, cpi->oxcf.noise_block_size,
                         cpi->oxcf.noise_level, time_stamp, end_time) < 0)
      res = -1;
#endif  // !CONFIG_REALTIME_ONLY
  }
#endif  //  CONFIG_DENOISE

  if (av1_lookahead_push(cpi->ppi->lookahead, sd, time_stamp, end_time,
                         use_highbitdepth, cpi->alloc_pyramid, frame_flags)) {
    aom_set_error(cm->error, AOM_CODEC_ERROR, "av1_lookahead_push() failed");
    res = -1;
  }
#if CONFIG_INTERNAL_STATS
  aom_usec_timer_mark(&timer);
  cpi->ppi->total_time_receive_data += aom_usec_timer_elapsed(&timer);
#endif

  // Note: Regarding profile setting, the following checks are added to help
  // choose a proper profile for the input video. The criterion is that all
  // bitstreams must be designated as the lowest profile that match its content.
  // E.G. A bitstream that contains 4:4:4 video must be designated as High
  // Profile in the seq header, and likewise a bitstream that contains 4:2:2
  // bitstream must be designated as Professional Profile in the sequence
  // header.
  if ((seq_params->profile == PROFILE_0) && !seq_params->monochrome &&
      (subsampling_x != 1 || subsampling_y != 1)) {
    aom_set_error(cm->error, AOM_CODEC_INVALID_PARAM,
                  "Non-4:2:0 color format requires profile 1 or 2");
    res = -1;
  }
  if ((seq_params->profile == PROFILE_1) &&
      !(subsampling_x == 0 && subsampling_y == 0)) {
    aom_set_error(cm->error, AOM_CODEC_INVALID_PARAM,
                  "Profile 1 requires 4:4:4 color format");
    res = -1;
  }
  if ((seq_params->profile == PROFILE_2) &&
      (seq_params->bit_depth <= AOM_BITS_10) &&
      !(subsampling_x == 1 && subsampling_y == 0)) {
    aom_set_error(cm->error, AOM_CODEC_INVALID_PARAM,
                  "Profile 2 bit-depth <= 10 requires 4:2:2 color format");
    res = -1;
  }

  return res;
}